

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

SparseBVUnit * __thiscall
BVSparse<Memory::JitArenaAllocator>::BitsFromIndex
          (BVSparse<Memory::JitArenaAllocator> *this,BVIndex i)

{
  BVSparseNode *pBVar1;
  SparseBVUnit *pSVar2;
  Type *local_10;
  Type *prevNextField;
  
  local_10 = (Type *)0x0;
  pBVar1 = NodeFromIndex(this,i,&local_10);
  if (pBVar1 == (BVSparseNode *)0x0) {
    pSVar2 = &s_EmptyUnit;
  }
  else {
    pSVar2 = &pBVar1->data;
  }
  return pSVar2;
}

Assistant:

const SparseBVUnit *
BVSparse<TAllocator>::BitsFromIndex(BVIndex i) const
{
    Field(BVSparseNode*, TAllocator) const* prevNextField = nullptr;
    const BVSparseNode * node = NodeFromIndex(i, &prevNextField);
    if (node)
    {
        return &node->data;
    }
    else
    {
        return (SparseBVUnit *)&BVSparse::s_EmptyUnit;
    }
}